

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  Cluster<double> *cluster;
  istream *in;
  pointer pCVar7;
  double *value;
  double *pdVar8;
  float fVar9;
  double local_280;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  points;
  vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> clusters;
  ifstream infile;
  
  if (argc < 2) {
    local_280 = 1.0;
  }
  else {
    std::__cxx11::string::string((string *)&infile,argv[1],(allocator *)&points);
    fVar9 = std::__cxx11::stof((string *)&infile,(size_t *)0x0);
    local_280 = (double)fVar9;
    std::__cxx11::string::~string((string *)&infile);
  }
  std::ifstream::ifstream(&infile);
  if (argc < 3) {
    iVar2 = fileno(_stdin);
    iVar3 = isatty(iVar2);
    iVar2 = 0;
    if (iVar3 == 0) {
      in = (istream *)&std::cin;
      goto LAB_001044da;
    }
    std::operator<<((ostream *)&std::cout,"Input CSV file: ");
    points.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&points.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    points.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    points.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    std::operator>>((istream *)&std::cin,(string *)&points);
    std::ifstream::open((string *)&infile,(_Ios_Openmode)&points);
  }
  else {
    in = (istream *)&infile;
    std::ifstream::open((char *)in,(_Ios_Openmode)argv[2]);
    iVar2 = 0;
    if (argc == 3) goto LAB_001044da;
    std::__cxx11::string::string((string *)&points,argv[3],(allocator *)&clusters);
    iVar2 = std::__cxx11::stoi((string *)&points,(size_t *)0x0,10);
  }
  in = (istream *)&infile;
  std::__cxx11::string::~string((string *)&points);
LAB_001044da:
  std::operator<<((ostream *)&std::cerr,"Kernel bandwidth: ");
  poVar4 = std::ostream::_M_insert<double>(local_280);
  std::endl<char,std::char_traits<char>>(poVar4);
  load(&points,in,iVar2);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Num. points: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  if (points.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      points.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = std::chrono::_V2::system_clock::now();
    msc::
    mean_shift_cluster<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
              (1.0 / local_280,(msc *)0x3e80000000000000,&clusters,
               points.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               points.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (ulong)((long)((points.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)((points.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3,0x7fffffff);
    lVar6 = std::chrono::_V2::system_clock::now();
    poVar4 = std::operator<<((ostream *)&std::cerr,"Clusters (");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"):");
    std::endl<char,std::char_traits<char>>(poVar4);
    for (pCVar7 = clusters.
                  super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar7 != clusters.
                  super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pCVar7 = pCVar7 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr," - Num. elems.: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"; Mode:");
      pdVar1 = (pCVar7->mode).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar8 = (pCVar7->mode).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
        std::operator<<((ostream *)&std::cerr," ");
        std::ostream::_M_insert<double>(*pdVar8);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    }
    std::operator<<((ostream *)&std::cerr,"Elapsed time: ");
    poVar4 = std::ostream::_M_insert<double>((double)((lVar6 - lVar5) / 1000) / 1000000.0);
    poVar4 = std::operator<<(poVar4," s");
    std::endl<char,std::char_traits<char>>(poVar4);
    dump(&points,&clusters);
    std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::~vector(&clusters);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&points);
  std::ifstream::~ifstream(&infile);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    const double bandwidth = argc > 1 ? std::stof(argv[1]) : 1;
    std::istream* in = &std::cin;
    std::ifstream infile;
    if (argc > 2)
    {
        infile.open(argv[2]);
        in = &infile;
    }
    else
    {
        #ifdef _WIN32
        if (_isatty(_fileno(stdin)))
        #else
        if (isatty(fileno(stdin)))
        #endif
        {
            std::cout << "Input CSV file: ";
            std::string filename;
            std::cin >> filename;
            infile.open(filename);
            in = &infile;
        }
    }
    const int col_offset = argc > 3 ? std::stoi(argv[3]) : 0;

    std::cerr << "Kernel bandwidth: " << bandwidth << std::endl;
    const auto points = load(*in, col_offset);
    std::cerr << "Num. points: " << points.size() << std::endl;
    if (points.empty())
        return 0;
    const auto t0 = std::chrono::high_resolution_clock::now();
    const auto clusters = msc::mean_shift_cluster<Scalar>(
        std::begin(points), std::end(points), points[0].size(),
        msc::metrics::L2Sq(),
        msc::kernels::ParabolicSq(),
        msc::estimators::Constant(bandwidth));
    const auto t1 = std::chrono::high_resolution_clock::now();
    std::cerr << "Clusters (" << clusters.size() << "):" << std::endl;
    for (const auto& cluster : clusters)
    {
        std::cerr << " - Num. elems.: " << cluster.members.size() << "; Mode:";
        for (const auto& value : cluster.mode)
            std::cerr << " " << value;
        std::cerr << std::endl;
    }
    std::cerr << "Elapsed time: " << std::chrono::duration_cast<
        std::chrono::microseconds>(t1 - t0).count() / 1e6 << " s" << std::endl;
    dump(points, clusters);
    return 0;
}